

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlDocSetRootElement(xmlDocPtr doc,xmlNodePtr root)

{
  xmlNodePtr pxVar1;
  _xmlNode **pp_Var2;
  
  if ((root != (xmlNodePtr)0x0 && doc != (xmlDocPtr)0x0) && (root->type != XML_NAMESPACE_DECL)) {
    xmlUnlinkNode(root);
    xmlSetTreeDoc(root,doc);
    root->parent = (_xmlNode *)doc;
    pp_Var2 = &doc->children;
    while (pxVar1 = *pp_Var2, pxVar1 != (xmlNodePtr)0x0) {
      if (pxVar1->type == XML_ELEMENT_NODE) {
        xmlReplaceNode(pxVar1,root);
        return pxVar1;
      }
      pp_Var2 = &pxVar1->next;
    }
    pxVar1 = doc->children;
    if (pxVar1 == (xmlNodePtr)0x0) {
      doc->children = root;
      doc->last = root;
    }
    else {
      xmlAddSibling(pxVar1,root);
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlDocSetRootElement(xmlDocPtr doc, xmlNodePtr root) {
    xmlNodePtr old = NULL;

    if (doc == NULL) return(NULL);
    if ((root == NULL) || (root->type == XML_NAMESPACE_DECL))
	return(NULL);
    xmlUnlinkNode(root);
    xmlSetTreeDoc(root, doc);
    root->parent = (xmlNodePtr) doc;
    old = doc->children;
    while (old != NULL) {
	if (old->type == XML_ELEMENT_NODE)
	    break;
        old = old->next;
    }
    if (old == NULL) {
	if (doc->children == NULL) {
	    doc->children = root;
	    doc->last = root;
	} else {
	    xmlAddSibling(doc->children, root);
	}
    } else {
	xmlReplaceNode(old, root);
    }
    return(old);
}